

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-priority.c
# Opt level: O3

int run_test_process_priority(void)

{
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  undefined8 uVar4;
  undefined1 *puVar5;
  int extraout_EDX;
  code *unaff_RBX;
  size_t unaff_RBP;
  long *plVar6;
  long *plVar7;
  int *unaff_R14;
  long lVar8;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int priority;
  long lStack_fa0;
  char acStack_f98 [256];
  code *pcStack_e98;
  undefined8 uStack_e88;
  code *pcStack_e80;
  long lStack_e78;
  long lStack_e70;
  long lStack_e68;
  undefined8 auStack_e60 [13];
  undefined1 *puStack_df8;
  char *pcStack_df0;
  long *plStack_de8;
  long *plStack_de0;
  undefined8 uStack_dd8;
  code *pcStack_dc8;
  undefined1 *puStack_dc0;
  undefined1 **ppuStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 uStack_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 uStack_d80;
  long alStack_d78 [63];
  undefined1 uStack_b79;
  undefined1 auStack_b78 [1024];
  char *pcStack_778;
  char *pcStack_770;
  code *pcStack_768;
  undefined8 uStack_760;
  long lStack_758;
  char acStack_750 [512];
  code *pcStack_550;
  long alStack_548 [66];
  undefined8 uStack_338;
  undefined8 uStack_330;
  long lStack_328;
  long *plStack_320;
  char *pcStack_318;
  char *pcStack_310;
  char *pcStack_308;
  code *pcStack_300;
  undefined8 uStack_2f8;
  size_t sStack_2f0;
  char acStack_2e8 [520];
  code *pcStack_e0;
  long alStack_a8 [3];
  long alStack_90 [5];
  undefined8 auStack_68 [4];
  code *pcStack_48;
  int *piStack_40;
  code *local_30;
  code *local_28;
  int local_20;
  int local_1c;
  
  piStack_40 = (int *)0x1b6b8a;
  local_20 = uv_os_getpriority(0,0);
  local_28 = (code *)(long)local_20;
  local_30 = (code *)0xffffffffffffffea;
  if (local_28 == (code *)0xffffffffffffffea) {
    unaff_RBX = (code *)0xffffffffffffffec;
    unaff_R14 = &local_1c;
    local_28 = (code *)0xffffffffffffffea;
    do {
      piStack_40 = (int *)0x1b6bc8;
      local_20 = uv_os_setpriority(0,(ulong)unaff_RBX & 0xffffffff);
      if (local_20 != -0xd) {
        local_28 = (code *)(long)local_20;
        local_30 = (code *)0x0;
        if (local_28 == (code *)0x0) {
          piStack_40 = (int *)0x1b6bff;
          iVar1 = uv_os_getpriority(0,unaff_R14);
          local_28 = (code *)(long)iVar1;
          local_30 = (code *)0x0;
          if (local_28 == (code *)0x0) {
            local_28 = (code *)(long)local_1c;
            local_30 = unaff_RBX;
            if (local_28 != unaff_RBX) {
LAB_001b6d09:
              piStack_40 = (int *)0x1b6d18;
              run_test_process_priority_cold_4();
              goto LAB_001b6d18;
            }
            piStack_40 = (int *)0x1b6c43;
            uVar2 = uv_os_getpid();
            piStack_40 = (int *)0x1b6c4d;
            iVar1 = uv_os_getpriority(uVar2,&local_20);
            local_28 = (code *)(long)iVar1;
            local_30 = (code *)0x0;
            if (local_28 == (code *)0x0) {
              local_28 = (code *)(long)local_1c;
              local_30 = (code *)(long)local_20;
              if (local_28 == local_30) goto LAB_001b6c8d;
              piStack_40 = (int *)0x1b6d09;
              run_test_process_priority_cold_6();
              goto LAB_001b6d09;
            }
            goto LAB_001b6d27;
          }
        }
        else {
LAB_001b6d18:
          piStack_40 = (int *)0x1b6d27;
          run_test_process_priority_cold_2();
LAB_001b6d27:
          piStack_40 = (int *)0x1b6d36;
          run_test_process_priority_cold_5();
        }
        piStack_40 = (int *)0x1b6d45;
        run_test_process_priority_cold_3();
        goto LAB_001b6d45;
      }
LAB_001b6c8d:
      unaff_RBX = unaff_RBX + 1;
    } while (unaff_RBX != (code *)0x14);
    piStack_40 = (int *)0x1b6ca6;
    iVar1 = uv_os_setpriority(0,0xffffffeb);
    local_28 = (code *)(long)iVar1;
    local_30 = (code *)0xffffffffffffffea;
    if (local_28 != (code *)0xffffffffffffffea) goto LAB_001b6d54;
    piStack_40 = (int *)0x1b6cd2;
    iVar1 = uv_os_setpriority(0,0x14);
    local_28 = (code *)(long)iVar1;
    local_30 = (code *)0xffffffffffffffea;
    if (local_28 == (code *)0xffffffffffffffea) {
      return 0;
    }
  }
  else {
LAB_001b6d45:
    piStack_40 = (int *)0x1b6d54;
    run_test_process_priority_cold_1();
LAB_001b6d54:
    piStack_40 = (int *)0x1b6d63;
    run_test_process_priority_cold_7();
  }
  piStack_40 = (int *)0x1b6d72;
  run_test_process_priority_cold_8();
  pcStack_48 = unaff_RBX;
  piStack_40 = unaff_R14;
  iVar1 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  alStack_90[0] = (long)iVar1;
  auStack_68[0] = 0;
  if (alStack_90[0] != 0) goto LAB_001b6ee6;
  iVar1 = uv_sem_init(auStack_68,0);
  alStack_90[0] = (long)iVar1;
  alStack_a8[2] = 0;
  if (alStack_90[0] != 0) goto LAB_001b6ef5;
  iVar1 = uv_thread_create(alStack_a8 + 2,getter_thread_body,auStack_68);
  alStack_90[0] = (long)iVar1;
  alStack_a8[0] = 0;
  if (alStack_90[0] == 0) {
    lVar8 = 0;
    unaff_RBX = setter_thread_body;
    do {
      alStack_a8[0] = 0;
      iVar1 = uv_thread_create((long)alStack_90 + lVar8,setter_thread_body,0);
      alStack_a8[0] = (long)iVar1;
      alStack_a8[1] = 0;
      if (alStack_a8[0] != 0) {
        run_test_process_title_threadsafe_cold_4();
        goto LAB_001b6ed7;
      }
      lVar8 = lVar8 + 8;
    } while (lVar8 != 0x20);
    unaff_RBX = (code *)0x0;
    do {
      alStack_a8[0] = 0;
      alStack_a8[1] = 0;
      iVar1 = uv_thread_join((code *)((long)alStack_90 + (long)unaff_RBX));
      alStack_a8[0] = (long)iVar1;
      alStack_a8[1] = 0;
      if (alStack_a8[0] != 0) goto LAB_001b6ed7;
      unaff_RBX = unaff_RBX + 8;
    } while (unaff_RBX != (code *)0x20);
    uv_sem_post(auStack_68);
    iVar1 = uv_thread_join(alStack_a8 + 2);
    alStack_a8[0] = (long)iVar1;
    alStack_a8[1] = 0;
    if (alStack_a8[0] == 0) {
      uv_sem_destroy(auStack_68);
      return 0;
    }
    goto LAB_001b6f13;
  }
  goto LAB_001b6f04;
LAB_001b706e:
  uStack_338 = 0x1b7076;
  iVar3 = uv_set_process_title
                    ("8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled");
  lStack_328 = (long)iVar3;
  uStack_330 = 0;
  if (lStack_328 != 0) {
LAB_001b7136:
    uStack_338 = 0x1b7143;
    setter_thread_body_cold_1();
    plVar7 = alStack_548;
    pcStack_550 = (code *)0x1b7157;
    set_title("%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s%s");
    pcStack_550 = (code *)0x1b7163;
    set_title("new title");
    pcStack_550 = (code *)0x1b716f;
    iVar1 = uv_get_process_title(0,100);
    alStack_548[2] = (long)iVar1;
    alStack_548[0] = -0x16;
    if (alStack_548[2] == -0x16) {
      pcStack_550 = (code *)0x1b7195;
      iVar1 = uv_get_process_title(alStack_548 + 2,0);
      alStack_548[0] = (long)iVar1;
      alStack_548[1] = 0xffffffffffffffea;
      if (alStack_548[0] != -0x16) goto LAB_001b71ef;
      pcStack_550 = (code *)0x1b71be;
      iVar1 = uv_get_process_title(alStack_548 + 2,1);
      alStack_548[0] = (long)iVar1;
      alStack_548[1] = 0xffffffffffffff97;
      if (alStack_548[0] == -0x69) {
        return 0;
      }
    }
    else {
      pcStack_550 = (code *)0x1b71ef;
      run_test_process_title_cold_1();
LAB_001b71ef:
      pcStack_550 = (code *)0x1b71fc;
      run_test_process_title_cold_2();
    }
    pcStack_550 = set_title;
    run_test_process_title_cold_3();
    pcStack_550 = (code *)0x1f3532;
    pcStack_768 = (code *)0x1b7223;
    iVar1 = uv_get_process_title(acStack_750,0x200);
    lStack_758 = (long)iVar1;
    uStack_760 = 0;
    if (lStack_758 == 0) {
      pcStack_768 = (code *)0x1b7245;
      iVar1 = uv_set_process_title(plVar7);
      lStack_758 = (long)iVar1;
      uStack_760 = 0;
      if (lStack_758 != 0) goto LAB_001b72c5;
      pcStack_768 = (code *)0x1b726e;
      iVar1 = uv_get_process_title(acStack_750,0x200);
      lStack_758 = (long)iVar1;
      uStack_760 = 0;
      if (lStack_758 != 0) goto LAB_001b72d2;
      pcStack_768 = (code *)0x1b7295;
      iVar1 = strcmp(acStack_750,(char *)plVar7);
      lStack_758 = (long)iVar1;
      uStack_760 = 0;
      if (lStack_758 == 0) {
        return iVar1;
      }
    }
    else {
      pcStack_768 = (code *)0x1b72c5;
      set_title_cold_1();
LAB_001b72c5:
      pcStack_768 = (code *)0x1b72d2;
      set_title_cold_2();
LAB_001b72d2:
      pcStack_768 = (code *)0x1b72df;
      set_title_cold_3();
    }
    pcStack_768 = run_test_process_title_big_argv;
    set_title_cold_4();
    pcStack_768 = (code *)0x1f35c8;
    pcStack_770 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
    plVar6 = &lStack_e78;
    lStack_e68 = 0x3ff;
    puVar5 = auStack_b78;
    pcStack_e80 = (code *)0x1b7314;
    pcStack_778 = (char *)plVar7;
    iVar1 = uv_exepath(puVar5);
    alStack_d78[0] = (long)iVar1;
    auStack_e60[0] = 0;
    if (alStack_d78[0] == 0) {
      auStack_b78[lStack_e68] = 0;
      pcStack_e80 = (code *)0x1b7364;
      memset(alStack_d78,0x78,0x1ff);
      uStack_b79 = 0;
      ppuStack_db8 = &puStack_df8;
      pcStack_df0 = "process_title_big_argv_helper";
      uStack_dd8 = 0;
      uStack_db0 = 0;
      uStack_da8 = 0;
      uStack_da0 = 0;
      uStack_d98 = 0;
      uStack_d90 = 0;
      uStack_d88 = 0;
      uStack_d80 = 0;
      pcStack_dc8 = exit_cb;
      pcStack_e80 = (code *)0x1b73c2;
      puStack_df8 = puVar5;
      plStack_de8 = alStack_d78;
      plStack_de0 = alStack_d78;
      puStack_dc0 = puVar5;
      uVar4 = uv_default_loop();
      pcStack_e80 = (code *)0x1b73d2;
      iVar1 = uv_spawn(uVar4,auStack_e60,&pcStack_dc8);
      lStack_e70 = (long)iVar1;
      lStack_e78 = 0;
      if (lStack_e70 != 0) goto LAB_001b7485;
      pcStack_e80 = (code *)0x1b73f1;
      uVar4 = uv_default_loop();
      pcStack_e80 = (code *)0x1b73fb;
      iVar1 = uv_run(uVar4,0);
      lStack_e70 = (long)iVar1;
      lStack_e78 = 0;
      if (lStack_e70 == 0) {
        pcStack_e80 = (code *)0x1b741a;
        puVar5 = (undefined1 *)uv_default_loop();
        pcStack_e80 = (code *)0x1b742e;
        uv_walk(puVar5,close_walk_cb,0);
        pcStack_e80 = (code *)0x1b7438;
        uv_run(puVar5,0);
        lStack_e70 = 0;
        pcStack_e80 = (code *)0x1b7446;
        uVar4 = uv_default_loop();
        pcStack_e80 = (code *)0x1b744e;
        iVar1 = uv_loop_close(uVar4);
        lStack_e78 = (long)iVar1;
        if (lStack_e70 == lStack_e78) {
          pcStack_e80 = (code *)0x1b7464;
          uv_library_shutdown();
          return 0;
        }
        goto LAB_001b749f;
      }
    }
    else {
      pcStack_e80 = (code *)0x1b7485;
      run_test_process_title_big_argv_cold_1();
LAB_001b7485:
      pcStack_e80 = (code *)0x1b7492;
      run_test_process_title_big_argv_cold_2();
    }
    pcStack_e80 = (code *)0x1b749f;
    run_test_process_title_big_argv_cold_3();
LAB_001b749f:
    pcStack_e80 = exit_cb;
    run_test_process_title_big_argv_cold_4();
    uStack_e88 = 0;
    if (plVar6 == (long *)0x0) {
      pcStack_e80 = (code *)(long)extraout_EDX;
      uStack_e88 = 0;
      if (pcStack_e80 == (code *)0x0) {
        iVar1 = uv_close();
        return iVar1;
      }
    }
    else {
      pcStack_e98 = (code *)0x1b7501;
      pcStack_e80 = (code *)plVar6;
      exit_cb_cold_1();
    }
    pcStack_e98 = process_title_big_argv;
    exit_cb_cold_2();
    pcStack_e98 = (code *)puVar5;
    memset(acStack_f98,0,0x100);
    builtin_strncpy(acStack_f98,"fail",4);
    uv_get_process_title(acStack_f98,0x100);
    lStack_fa0 = 0;
    iVar1 = strcmp(acStack_f98,"fail");
    if (lStack_fa0 != iVar1) {
      return (int)lStack_fa0;
    }
    plVar7 = &lStack_fa0;
    process_title_big_argv_cold_1();
    iVar1 = uv_is_closing();
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_close(plVar7,0);
    return iVar1;
  }
  uStack_338 = 0x1b709c;
  iVar3 = uv_set_process_title
                    ("jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82");
  lStack_328 = (long)iVar3;
  uStack_330 = 0;
  if (lStack_328 != 0) {
LAB_001b7129:
    uStack_338 = 0x1b7136;
    setter_thread_body_cold_2();
    goto LAB_001b7136;
  }
  uStack_338 = 0x1b70be;
  iVar3 = uv_set_process_title
                    ("9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT");
  lStack_328 = (long)iVar3;
  uStack_330 = 0;
  if (lStack_328 != 0) {
LAB_001b711c:
    uStack_338 = 0x1b7129;
    setter_thread_body_cold_3();
    goto LAB_001b7129;
  }
  uStack_338 = 0x1b70e0;
  iVar3 = uv_set_process_title
                    ("n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU");
  lStack_328 = (long)iVar3;
  uStack_330 = 0;
  if (lStack_328 != 0) {
    uStack_338 = 0x1b711c;
    setter_thread_body_cold_4();
    goto LAB_001b711c;
  }
  iVar1 = iVar1 + -1;
  lStack_328 = 0;
  if (iVar1 == 0) {
    return iVar3;
  }
  goto LAB_001b706e;
LAB_001b6ed7:
  run_test_process_title_threadsafe_cold_5();
LAB_001b6ee6:
  run_test_process_title_threadsafe_cold_1();
LAB_001b6ef5:
  run_test_process_title_threadsafe_cold_2();
LAB_001b6f04:
  run_test_process_title_threadsafe_cold_3();
LAB_001b6f13:
  plVar7 = alStack_a8;
  run_test_process_title_threadsafe_cold_6();
  pcStack_300 = (code *)0x1b6f3b;
  pcStack_e0 = unaff_RBX;
  iVar1 = uv_sem_trywait();
  if (iVar1 == -0xb) {
    do {
      pcStack_300 = (code *)0x1b6f6b;
      iVar1 = uv_get_process_title(acStack_2e8,0x200);
      sStack_2f0 = (size_t)iVar1;
      uStack_2f8 = 0;
      if (sStack_2f0 != 0) {
LAB_001b702f:
        pcStack_300 = (code *)0x1b703c;
        getter_thread_body_cold_1();
LAB_001b703c:
        pcStack_300 = setter_thread_body;
        getter_thread_body_cold_3();
        pcStack_308 = "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled";
        pcStack_318 = "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82";
        iVar1 = 0x32;
        plStack_320 = plVar7;
        pcStack_310 = acStack_2e8;
        pcStack_300 = (code *)unaff_RBP;
        goto LAB_001b706e;
      }
      pcStack_300 = (code *)0x1b6f91;
      unaff_RBP = strlen(acStack_2e8);
      uStack_2f8 = 0;
      sStack_2f0 = unaff_RBP;
      if ((long)unaff_RBP < 1) {
        pcStack_300 = (code *)0x1b702f;
        getter_thread_body_cold_2();
        goto LAB_001b702f;
      }
      pcStack_300 = (code *)0x1b6fba;
      iVar1 = strncmp(acStack_2e8,
                      "8L2NY0Kdj0XyNFZnmUZigIOfcWjyNr0SkMmUhKw99VLUsZFrvCQQC3XIRfNR8pjyMjXObllled",
                      unaff_RBP);
      if (iVar1 != 0) {
        pcStack_300 = (code *)0x1b6fcc;
        iVar1 = strncmp(acStack_2e8,
                        "jUAcscJN49oLSN8GdmXj2Wo34XX2T2vp2j5khfajNQarlOulp57cE130yiY53ipJFnPyTn5i82"
                        ,unaff_RBP);
        if (iVar1 == 0) goto LAB_001b6ff8;
        pcStack_300 = (code *)0x1b6fde;
        iVar1 = strncmp(acStack_2e8,
                        "9niCI5icXGFS72XudhXqo5alftmZ1tpE7B3cwUmrq0CCDjC84FzBNB8XAHqvpNQfI2QAQG6ztT"
                        ,unaff_RBP);
        if (iVar1 == 0) goto LAB_001b6ff8;
        pcStack_300 = (code *)0x1b6ff4;
        iVar1 = strncmp(acStack_2e8,
                        "n8qXVXuG6IEHDpabJgTEiwtpY6LHMZ8MgznnMpdHARu5EywufA6hcBaQfetb0YhEsK0ykDd7JU"
                        ,unaff_RBP);
        if (iVar1 == 0) goto LAB_001b6ff8;
        goto LAB_001b703c;
      }
LAB_001b6ff8:
      pcStack_300 = (code *)0x1b6fff;
      uv_sleep(0);
      pcStack_300 = (code *)0x1b7007;
      iVar1 = uv_sem_trywait(plVar7);
    } while (iVar1 == -0xb);
  }
  return iVar1;
}

Assistant:

TEST_IMPL(process_priority) {
  int priority;
  int r;
  int i;

#if defined(__MVS__)
  if (uv_os_setpriority(0, 0) == UV_ENOSYS)
    RETURN_SKIP("functionality not supported on zOS");
#endif

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  r = uv_os_getpriority(0, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  /* Verify that all valid values work. */
  for (i = UV_PRIORITY_HIGHEST; i <= UV_PRIORITY_LOW; i++) {
    r = uv_os_setpriority(0, i);

    /* If UV_EACCES is returned, the current user doesn't have permission to
       set this specific priority. */
    if (r == UV_EACCES)
      continue;

    ASSERT_OK(r);
    ASSERT_OK(uv_os_getpriority(0, &priority));

    /* Verify that the priority values match on Unix, and are range mapped
       on Windows. */
#ifndef _WIN32
    ASSERT_EQ(priority, i);
#else
    /* On Windows, only elevated users can set UV_PRIORITY_HIGHEST. Other
       users will silently be set to UV_PRIORITY_HIGH. */
    if (i < UV_PRIORITY_HIGH)
      ASSERT(priority == UV_PRIORITY_HIGHEST || priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_ABOVE_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_ABOVE_NORMAL);
    else if (i < UV_PRIORITY_BELOW_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_NORMAL);
    else if (i < UV_PRIORITY_LOW)
      ASSERT_EQ(priority, UV_PRIORITY_BELOW_NORMAL);
    else
      ASSERT_EQ(priority, UV_PRIORITY_LOW);
#endif

    /* Verify that the current PID and 0 are equivalent. */
    ASSERT_OK(uv_os_getpriority(uv_os_getpid(), &r));
    ASSERT_EQ(priority, r);
  }

  /* Verify that invalid priorities return UV_EINVAL. */
  ASSERT_EQ(uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1), UV_EINVAL);
  ASSERT_EQ(uv_os_setpriority(0, UV_PRIORITY_LOW + 1), UV_EINVAL);

  return 0;
}